

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O2

tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
* eval_args_abi_cxx11_
            (tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *__return_storage_ptr__,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  ImageSize IVar7;
  runtime_error *prVar8;
  int num_threads;
  int local_8c;
  double local_88;
  double local_80;
  double local_78;
  string filename;
  string colors;
  
  if (argc - 0xcU < 0xfffffffe) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"invalid number of arguments");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_8c = eval_arg<int>(argv[1],1,100000);
  iVar1 = eval_arg<int>(argv[2],1,100000);
  iVar2 = eval_arg<int>(argv[3],1,1000000000);
  iVar3 = eval_arg<int>(argv[4],1,1000000);
  local_78 = eval_arg<double>(argv[5],-100.0,100.0);
  local_80 = eval_arg<double>(argv[6],-100.0,100.0);
  local_88 = eval_arg<double>(argv[7],-100.0,100.0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colors,argv[8],(allocator<char> *)&filename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,argv[9],(allocator<char> *)&num_threads);
  if (argc == 0xb) {
    iVar4 = eval_arg<int>(argv[10],2,1000);
  }
  else {
    iVar5 = std::thread::hardware_concurrency();
    iVar4 = 6;
    if (6 < iVar5) {
      iVar4 = iVar5;
    }
    iVar4 = iVar4 + -2;
  }
  num_threads = iVar4;
  poVar6 = std::operator<<((ostream *)&std::cout,"using ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
  std::operator<<(poVar6," threads\n");
  if (iVar4 <= iVar1) {
    std::_Tuple_impl<4ul,std::__cxx11::string,std::__cxx11::string,int>::
    _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,int&,void>
              ((_Tuple_impl<4ul,std::__cxx11::string,std::__cxx11::string,int> *)
               __return_storage_ptr__,&colors,&filename,&num_threads);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .
    super__Tuple_impl<2UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .
    super__Tuple_impl<3UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .super__Head_base<3UL,_int,_false>._M_head_impl = iVar3;
    *(int *)&(__return_storage_ptr__->
             super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             ).
             super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             .
             super__Tuple_impl<2UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             .
             super__Tuple_impl<3UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             .field_0x4c = iVar2;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .super__Head_base<1UL,_Section,_false>._M_head_impl.center_x = local_78;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .super__Head_base<1UL,_Section,_false>._M_head_impl.center_y = local_80;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .super__Head_base<1UL,_Section,_false>._M_head_impl.height = local_88;
    IVar7.height = iVar1;
    IVar7.width = local_8c;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ).super__Head_base<0UL,_ImageSize,_false>._M_head_impl = IVar7;
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&colors);
    return __return_storage_ptr__;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar8,
             "maximum number of threads must not exceed the number of pixel rows of the image");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto eval_args(const int argc, char const* argv[])
{
    if (argc < 10 || argc > 11)
        throw std::runtime_error("invalid number of arguments");

    auto image_width    = eval_arg(argv[1], 1, 100000);
    auto image_height   = eval_arg(argv[2], 1, 100000);
    auto max_iterations = eval_arg(argv[3], 1, 1000000000);
    auto repetitions    = eval_arg(argv[4], 1, 1000000);
    auto center_x       = eval_arg(argv[5], -100.0, 100.0);
    auto center_y       = eval_arg(argv[6], -100.0, 100.0);
    auto height         = eval_arg(argv[7], -100.0, 100.0);
    auto colors         = std::string{argv[8]};
    auto filename       = std::string{argv[9]};
    auto num_threads    = (argc == 11) ? eval_arg(argv[10], 2, 1000) : std::max(static_cast<int>(std::thread::hardware_concurrency()) - 2, 4);

    std::cout << "using " << num_threads << " threads\n";

    if (num_threads > image_height)
        throw std::runtime_error("maximum number of threads must not exceed the number of pixel rows of the image");

    return std::make_tuple(ImageSize{image_width, image_height}, Section{center_x, center_y, height}, max_iterations, repetitions, colors, filename, num_threads);
}